

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

int nni_copyout_str(char *str,void *dst,size_t *szp,nni_type t)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = 0x1e;
  if (t == NNI_TYPE_STRING) {
    pcVar2 = nni_strdup(str);
    if (pcVar2 == (char *)0x0) {
      iVar1 = 2;
    }
    else {
      *(char **)dst = pcVar2;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
nni_copyout_str(const char *str, void *dst, size_t *szp, nni_type t)
{
	char *s;
	NNI_ARG_UNUSED(szp);
	if (t != NNI_TYPE_STRING) {
		return (NNG_EBADTYPE);
	}

	if ((s = nni_strdup(str)) == NULL) {
		return (NNG_ENOMEM);
	}
	*(char **) dst = s;
	return (0);
}